

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_thread.c
# Opt level: O3

QcCondition * qc_thread_condition_create(void)

{
  int iVar1;
  pthread_cond_t *__cond;
  QcCondition *pQVar2;
  pthread_cond_t *__cond_00;
  
  __cond_00 = (pthread_cond_t *)0x1;
  __cond = (pthread_cond_t *)calloc(1,0x30);
  if (__cond != (pthread_cond_t *)0x0) {
    iVar1 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
    if (iVar1 != 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
                ,0x145,"thread cond create failed");
      free(__cond);
      __cond = (pthread_cond_t *)0x0;
    }
    return (QcCondition *)__cond;
  }
  qc_thread_condition_create_cold_1();
  iVar1 = pthread_cond_destroy(__cond_00);
  if (iVar1 == 0) {
    free(__cond_00);
    pQVar2 = (QcCondition *)0x0;
  }
  else {
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_thread.c"
              ,0x152,"thread cond destroy failed");
    pQVar2 = (QcCondition *)0xffffffff;
  }
  return pQVar2;
}

Assistant:

QcCondition* qc_thread_condition_create()
{
    QcCondition *cond;

    qc_malloc(cond, sizeof(QcCondition));
    if(NULL == cond)
    {
        return NULL;
    }

    if(0 != pthread_cond_init(&cond->cond_t, NULL))
    {
        qc_error("thread cond create failed");
        qc_free(cond);
        return NULL;
    }

    return cond;
}